

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# CircularBuffer.cpp
# Opt level: O3

int __thiscall
JetHead::CircularBuffer::write_internal(CircularBuffer *this,uint8_t *buffer,int size)

{
  int iVar1;
  uint32_t uVar2;
  uint8_t *puVar3;
  uint8_t *puVar4;
  uint uVar5;
  uint uVar6;
  AutoLock lock;
  AutoLock local_48;
  
  uVar6 = 0;
  if (buffer != (uint8_t *)0x0) {
    AutoLock::AutoLock(&local_48,&this->mLock);
    iVar1 = this->mBufferSize;
    uVar2 = this->mLen;
    AutoLock::~AutoLock(&local_48);
    if ((int)(iVar1 - uVar2) < size) {
      AutoLock::AutoLock(&local_48,&this->mLock);
      size = this->mBufferSize - this->mLen;
      AutoLock::~AutoLock(&local_48);
    }
    if (size != 0) {
      puVar4 = this->mWritePtr;
      puVar3 = this->mEnd;
      uVar5 = (int)puVar3 - (int)puVar4;
      uVar6 = uVar5;
      if (size < (int)uVar5) {
        uVar6 = size;
      }
      if (((puVar4 != buffer) && (puVar4 != (uint8_t *)0x0)) && (0 < (int)uVar6)) {
        memcpy(puVar4,buffer,(ulong)uVar6);
        puVar4 = this->mWritePtr;
        puVar3 = this->mEnd;
      }
      puVar4 = puVar4 + (int)uVar6;
      this->mWritePtr = puVar4;
      if (puVar4 == puVar3) {
        puVar4 = this->mBuffer;
        this->mWritePtr = puVar4;
      }
      if ((int)uVar5 < size) {
        uVar5 = size - uVar6;
        if (((buffer + (int)uVar6 != puVar4) && (0 < (int)uVar5)) && (puVar4 != (uint8_t *)0x0)) {
          memcpy(puVar4,buffer + (int)uVar6,(ulong)uVar5);
          puVar4 = this->mWritePtr;
        }
        this->mWritePtr = puVar4 + (int)uVar5;
      }
      add_length_internal(this,size);
      Condition::Broadcast(&this->mDataCondition);
      uVar6 = size;
    }
  }
  return uVar6;
}

Assistant:

int CircularBuffer::write_internal( const uint8_t *buffer, int size )
{
	TRACE_BEGIN( LOG_LVL_NOISE );
	
	if ( buffer == NULL )
		return 0;
	
	// limit size to free space, we will return this for the size of
	// this write
	if ( size > getFreeSpace() )
		size = getFreeSpace();

	// if size is zero, return early
	if ( size == 0 )
		return 0;
	
	// first, copy from the write pointer up to the end of the buffer,
	// note that this truncates implicitly to no more than free space
	int tail_size = mEnd - mWritePtr;

	// truncate tail_size to the requested write size, note that size
	// has already been truncated to no more than free space
	if ( tail_size > size )
		tail_size = size;

	bufferCopy( mWritePtr, buffer, tail_size );
	mWritePtr += tail_size;

	// if the write pointer is now at the end of the buffer, then
	// reset it to the beginning of the buffer
	if ( mWritePtr == mEnd )
		mWritePtr = mBuffer;

	// if tail_size is less than size, then we haven't filled free
	// space up to the write request size, so continue at the begining
	// of the buffer
	if ( tail_size < size )
	{
		// compute the remainder of the size bytes to write, which we
		// have already truncated to available free space
		int head_size = size - tail_size;
		
		// copy head_size bytes into the begining of the circular
		// buffer from offset tail_size within our input buffer
		if (buffer != NULL)
		{
			bufferCopy( mWritePtr, buffer + tail_size, head_size );
		}
		mWritePtr += head_size;
	}
	
	// update the space now in use in the buffer
	add_length_internal( size );
	
	// signal all waiters for data.
	mDataCondition.Broadcast();

	LOG( "wp %p rd %p", mWritePtr, mReadPtr );

	return size;
}